

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

RefArrayVectorOf<char16_t> * __thiscall
xercesc_4_0::RegularExpression::tokenize
          (RegularExpression *this,char *expression,MemoryManager *manager)

{
  MemoryManager *matchString;
  XMLSize_t end;
  RefArrayVectorOf<char16_t> *pRVar1;
  undefined1 local_38 [8];
  ArrayJanitor<char16_t> janBuf;
  XMLCh *tmpBuf;
  MemoryManager *manager_local;
  char *expression_local;
  RegularExpression *this_local;
  
  janBuf.fMemoryManager = (MemoryManager *)XMLString::transcode(expression,manager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)local_38,(char16_t *)janBuf.fMemoryManager,manager);
  matchString = janBuf.fMemoryManager;
  end = XMLString::stringLen((XMLCh *)janBuf.fMemoryManager);
  pRVar1 = tokenize(this,(XMLCh *)matchString,0,end,manager);
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_38);
  return pRVar1;
}

Assistant:

RefArrayVectorOf<XMLCh>* RegularExpression::tokenize(const char* const expression,
                                                     MemoryManager* const manager) const
{

  XMLCh* tmpBuf = XMLString::transcode(expression, manager);
  ArrayJanitor<XMLCh> janBuf(tmpBuf, manager);
  return tokenize(tmpBuf, 0, XMLString::stringLen(tmpBuf), manager);
}